

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_db_status(sqlite3 *db,int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  long lVar1;
  void *pvVar2;
  Pager *pPVar3;
  Vdbe *p;
  LookasideSlot *pLVar4;
  LookasideSlot *pLVar5;
  Schema *pSVar6;
  _ht *p_Var7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Btree **ppBVar11;
  int iVar12;
  LookasideSlot *pLVar13;
  long lVar14;
  HashElem *pHVar15;
  long lVar16;
  int nByte_1;
  int nByte;
  uint local_58;
  int local_54;
  int *local_50;
  int local_48;
  int local_44;
  sqlite3 *local_40;
  int *local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  switch(op) {
  case 0:
    iVar8 = sqlite3LookasideUsed(db,pHighwater);
    *pCurrent = iVar8;
    iVar8 = 0;
    if (resetFlag != 0) {
      pLVar4 = (db->lookaside).pFree;
      pLVar5 = pLVar4;
      if (pLVar4 != (LookasideSlot *)0x0) {
        do {
          pLVar13 = pLVar5;
          pLVar5 = pLVar13->pNext;
        } while (pLVar5 != (LookasideSlot *)0x0);
        pLVar13->pNext = (db->lookaside).pInit;
        (db->lookaside).pInit = pLVar4;
        (db->lookaside).pFree = (LookasideSlot *)0x0;
      }
      pLVar4 = (db->lookaside).pSmallFree;
      pLVar5 = pLVar4;
      if (pLVar4 != (LookasideSlot *)0x0) {
        do {
          pLVar13 = pLVar5;
          pLVar5 = pLVar13->pNext;
        } while (pLVar5 != (LookasideSlot *)0x0);
        pLVar13->pNext = (db->lookaside).pSmallInit;
        (db->lookaside).pSmallInit = pLVar4;
        (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
      }
    }
    break;
  case 1:
  case 0xb:
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    iVar8 = db->nDb;
    local_38 = pCurrent;
    if (iVar8 < 1) {
      iVar9 = 0;
      local_50 = pHighwater;
    }
    else {
      lVar16 = 0;
      lVar14 = 8;
      iVar9 = 0;
      local_50 = pHighwater;
      local_40 = db;
      do {
        lVar1 = *(long *)((long)&db->aDb->zDbSName + lVar14);
        if (lVar1 != 0) {
          pvVar2 = (void *)**(undefined8 **)(lVar1 + 8);
          local_48 = *(int *)((long)pvVar2 + 200) + 0x78 + (uint)*(ushort *)((long)pvVar2 + 0xb0);
          local_54 = iVar9;
          iVar8 = (*sqlite3Config.pcache2.xPagecount)
                            (*(sqlite3_pcache **)(*(long *)((long)pvVar2 + 0x120) + 0x48));
          iVar8 = iVar8 * local_48;
          iVar9 = (*sqlite3Config.m.xSize)(pvVar2);
          iVar9 = iVar9 + iVar8 + *(int *)((long)pvVar2 + 200);
          if (op == 0xb) {
            iVar9 = iVar9 / *(int *)(*(long *)(lVar1 + 8) + 0x68);
          }
          iVar9 = local_54 + iVar9;
          iVar8 = local_40->nDb;
          db = local_40;
        }
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0x20;
      } while (lVar16 < iVar8);
    }
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    *local_38 = iVar9;
    *local_50 = 0;
    goto LAB_0011b603;
  case 2:
    local_58 = 0;
    local_50 = pHighwater;
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    db->pnBytesFreed = (int *)&local_58;
    (db->lookaside).pEnd = (db->lookaside).pStart;
    if (0 < db->nDb) {
      lVar14 = 0;
      do {
        pSVar6 = db->aDb[lVar14].pSchema;
        if (pSVar6 != (Schema *)0x0) {
          iVar8 = (*sqlite3Config.m.xRoundup)(0x20);
          local_58 = ((pSVar6->trigHash).count + (pSVar6->tblHash).count + (pSVar6->idxHash).count +
                     (pSVar6->fkeyHash).count) * iVar8 + local_58;
          p_Var7 = (pSVar6->tblHash).ht;
          iVar9 = 0;
          iVar8 = 0;
          if (p_Var7 != (_ht *)0x0) {
            iVar8 = (*sqlite3Config.m.xSize)(p_Var7);
          }
          local_58 = local_58 + iVar8;
          p_Var7 = (pSVar6->trigHash).ht;
          if (p_Var7 != (_ht *)0x0) {
            iVar9 = (*sqlite3Config.m.xSize)(p_Var7);
          }
          local_58 = local_58 + iVar9;
          p_Var7 = (pSVar6->idxHash).ht;
          iVar9 = 0;
          iVar8 = 0;
          if (p_Var7 != (_ht *)0x0) {
            iVar8 = (*sqlite3Config.m.xSize)(p_Var7);
          }
          local_58 = local_58 + iVar8;
          p_Var7 = (pSVar6->fkeyHash).ht;
          if (p_Var7 != (_ht *)0x0) {
            iVar9 = (*sqlite3Config.m.xSize)(p_Var7);
          }
          local_58 = local_58 + iVar9;
          for (pHVar15 = (pSVar6->trigHash).first; pHVar15 != (HashElem *)0x0;
              pHVar15 = pHVar15->next) {
            sqlite3DeleteTrigger(db,(Trigger *)pHVar15->data);
          }
          for (pHVar15 = (pSVar6->tblHash).first; pHVar15 != (HashElem *)0x0;
              pHVar15 = pHVar15->next) {
            sqlite3DeleteTable(db,(Table *)pHVar15->data);
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < db->nDb);
    }
    db->pnBytesFreed = (int *)0x0;
    (db->lookaside).pEnd = (db->lookaside).pTrueEnd;
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    *local_50 = 0;
    uVar10 = local_58;
    goto LAB_0011b5d5;
  case 3:
    local_44 = 0;
    db->pnBytesFreed = &local_44;
    p = db->pVdbe;
    (db->lookaside).pEnd = (db->lookaside).pStart;
    iVar8 = 0;
    for (; p != (Vdbe *)0x0; p = p->pVNext) {
      sqlite3VdbeDelete(p);
    }
    (db->lookaside).pEnd = (db->lookaside).pTrueEnd;
    db->pnBytesFreed = (int *)0x0;
    *pHighwater = 0;
    *pCurrent = local_44;
    break;
  case 4:
  case 5:
  case 6:
    *pCurrent = 0;
    *pHighwater = (db->lookaside).anStat[op - 4U];
    iVar8 = 0;
    if (resetFlag != 0) {
      (db->lookaside).anStat[op - 4U] = 0;
    }
    break;
  case 10:
    *pHighwater = 0;
    uVar10 = 1;
    if (db->nDeferredImmCons < 1) {
      uVar10 = (uint)(0 < db->nDeferredCons);
    }
LAB_0011b5d5:
    *pCurrent = uVar10;
LAB_0011b603:
    iVar8 = 0;
    break;
  case 0xc:
    op = 10;
  case 7:
  case 8:
  case 9:
    iVar9 = db->nDb;
    iVar8 = 0;
    iVar12 = 0;
    if (0 < iVar9) {
      ppBVar11 = &db->aDb->pBt;
      lVar14 = 0;
      iVar12 = 0;
      do {
        if (*ppBVar11 != (Btree *)0x0) {
          pPVar3 = (*ppBVar11)->pBt->pPager;
          iVar12 = iVar12 + pPVar3->aStat[op - 7U];
          if (resetFlag != 0) {
            pPVar3->aStat[op - 7U] = 0;
            iVar9 = db->nDb;
          }
        }
        lVar14 = lVar14 + 1;
        ppBVar11 = ppBVar11 + 4;
      } while (lVar14 < iVar9);
    }
    *pHighwater = 0;
    *pCurrent = iVar12;
    break;
  default:
    iVar8 = 1;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar8;
}

Assistant:

SQLITE_API int sqlite3_db_status(
  sqlite3 *db,          /* The database connection whose status is desired */
  int op,               /* Status verb */
  int *pCurrent,        /* Write current value here */
  int *pHighwater,      /* Write high-water mark here */
  int resetFlag         /* Reset high-water mark if true */
){
  int rc = SQLITE_OK;   /* Return code */
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pCurrent==0|| pHighwater==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  switch( op ){
    case SQLITE_DBSTATUS_LOOKASIDE_USED: {
      *pCurrent = sqlite3LookasideUsed(db, pHighwater);
      if( resetFlag ){
        LookasideSlot *p = db->lookaside.pFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pInit;
          db->lookaside.pInit = db->lookaside.pFree;
          db->lookaside.pFree = 0;
        }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
        p = db->lookaside.pSmallFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pSmallInit;
          db->lookaside.pSmallInit = db->lookaside.pSmallFree;
          db->lookaside.pSmallFree = 0;
        }
#endif
      }
      break;
    }

    case SQLITE_DBSTATUS_LOOKASIDE_HIT:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL: {
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_HIT );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)>=0 );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)<3 );
      *pCurrent = 0;
      *pHighwater = db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT];
      if( resetFlag ){
        db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT] = 0;
      }
      break;
    }

    /*
    ** Return an approximation for the amount of memory currently used
    ** by all pagers associated with the given database connection.  The
    ** highwater mark is meaningless and is returned as zero.
    */
    case SQLITE_DBSTATUS_CACHE_USED_SHARED:
    case SQLITE_DBSTATUS_CACHE_USED: {
      int totalUsed = 0;
      int i;
      sqlite3BtreeEnterAll(db);
      for(i=0; i<db->nDb; i++){
        Btree *pBt = db->aDb[i].pBt;
        if( pBt ){
          Pager *pPager = sqlite3BtreePager(pBt);
          int nByte = sqlite3PagerMemUsed(pPager);
          if( op==SQLITE_DBSTATUS_CACHE_USED_SHARED ){
            nByte = nByte / sqlite3BtreeConnectionCount(pBt);
          }
          totalUsed += nByte;
        }
      }
      sqlite3BtreeLeaveAll(db);
      *pCurrent = totalUsed;
      *pHighwater = 0;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store the schema for all databases (main, temp, and any ATTACHed
    ** databases.  *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_SCHEMA_USED: {
      int i;                      /* Used to iterate through schemas */
      int nByte = 0;              /* Used to accumulate return value */

      sqlite3BtreeEnterAll(db);
      db->pnBytesFreed = &nByte;
      assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
      db->lookaside.pEnd = db->lookaside.pStart;
      for(i=0; i<db->nDb; i++){
        Schema *pSchema = db->aDb[i].pSchema;
        if( ALWAYS(pSchema!=0) ){
          HashElem *p;

          nByte += sqlite3GlobalConfig.m.xRoundup(sizeof(HashElem)) * (
              pSchema->tblHash.count
            + pSchema->trigHash.count
            + pSchema->idxHash.count
            + pSchema->fkeyHash.count
          );
          nByte += sqlite3_msize(pSchema->tblHash.ht);
          nByte += sqlite3_msize(pSchema->trigHash.ht);
          nByte += sqlite3_msize(pSchema->idxHash.ht);
          nByte += sqlite3_msize(pSchema->fkeyHash.ht);

          for(p=sqliteHashFirst(&pSchema->trigHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTrigger(db, (Trigger*)sqliteHashData(p));
          }
          for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTable(db, (Table *)sqliteHashData(p));
          }
        }
      }
      db->pnBytesFreed = 0;
      db->lookaside.pEnd = db->lookaside.pTrueEnd;
      sqlite3BtreeLeaveAll(db);

      *pHighwater = 0;
      *pCurrent = nByte;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store all prepared statements.
    ** *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_STMT_USED: {
      struct Vdbe *pVdbe;         /* Used to iterate through VMs */
      int nByte = 0;              /* Used to accumulate return value */

      db->pnBytesFreed = &nByte;
      assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
      db->lookaside.pEnd = db->lookaside.pStart;
      for(pVdbe=db->pVdbe; pVdbe; pVdbe=pVdbe->pVNext){
        sqlite3VdbeDelete(pVdbe);
      }
      db->lookaside.pEnd = db->lookaside.pTrueEnd;
      db->pnBytesFreed = 0;

      *pHighwater = 0;  /* IMP: R-64479-57858 */
      *pCurrent = nByte;

      break;
    }

    /*
    ** Set *pCurrent to the total cache hits or misses encountered by all
    ** pagers the database handle is connected to. *pHighwater is always set
    ** to zero.
    */
    case SQLITE_DBSTATUS_CACHE_SPILL:
      op = SQLITE_DBSTATUS_CACHE_WRITE+1;
      /* no break */ deliberate_fall_through
    case SQLITE_DBSTATUS_CACHE_HIT:
    case SQLITE_DBSTATUS_CACHE_MISS:
    case SQLITE_DBSTATUS_CACHE_WRITE:{
      int i;
      int nRet = 0;
      assert( SQLITE_DBSTATUS_CACHE_MISS==SQLITE_DBSTATUS_CACHE_HIT+1 );
      assert( SQLITE_DBSTATUS_CACHE_WRITE==SQLITE_DBSTATUS_CACHE_HIT+2 );

      for(i=0; i<db->nDb; i++){
        if( db->aDb[i].pBt ){
          Pager *pPager = sqlite3BtreePager(db->aDb[i].pBt);
          sqlite3PagerCacheStat(pPager, op, resetFlag, &nRet);
        }
      }
      *pHighwater = 0; /* IMP: R-42420-56072 */
                       /* IMP: R-54100-20147 */
                       /* IMP: R-29431-39229 */
      *pCurrent = nRet;
      break;
    }

    /* Set *pCurrent to non-zero if there are unresolved deferred foreign
    ** key constraints.  Set *pCurrent to zero if all foreign key constraints
    ** have been satisfied.  The *pHighwater is always set to zero.
    */
    case SQLITE_DBSTATUS_DEFERRED_FKS: {
      *pHighwater = 0;  /* IMP: R-11967-56545 */
      *pCurrent = db->nDeferredImmCons>0 || db->nDeferredCons>0;
      break;
    }

    default: {
      rc = SQLITE_ERROR;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}